

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_serialize_struct
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string local_38;
  
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"await ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".WriteAsync(oprot, ",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix)
{
    (void)tstruct;
    out << indent() << "await " << prefix << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
}